

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SectionInfo * __thiscall Catch::SectionInfo::addSubSection(SectionInfo *this,string *name)

{
  SectionInfo *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>
  local_58;
  SectionInfo *local_20;
  SectionInfo *subSection;
  string *name_local;
  SectionInfo *this_local;
  
  subSection = (SectionInfo *)name;
  name_local = (string *)this;
  this_00 = (SectionInfo *)operator_new(0x40);
  SectionInfo(this_00,this);
  local_20 = this_00;
  std::make_pair<std::__cxx11::string_const&,Catch::SectionInfo*&>
            (&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)subSection,
             &local_20);
  std::
  map<std::__cxx11::string,Catch::SectionInfo*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>
  ::insert<std::pair<std::__cxx11::string,Catch::SectionInfo*>>
            ((map<std::__cxx11::string,Catch::SectionInfo*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>
              *)&this->m_subSections,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>
  ::~pair(&local_58);
  this->m_status = Branch;
  return local_20;
}

Assistant:

SectionInfo* addSubSection( const std::string& name ) {
            SectionInfo* subSection = new SectionInfo( this );
            m_subSections.insert( std::make_pair( name, subSection ) );
            m_status = Branch;
            return subSection;
        }